

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_allocator.cpp
# Opt level: O3

void * __thiscall dxil_spv::ChainAllocator::Block::allocate(Block *this,size_t size)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  ulong uVar2;
  
  uVar2 = this->offset + 0xf & 0xfffffffffffffff0;
  this->offset = uVar2;
  if (this->block_size < size + uVar2) {
    return (void *)0x0;
  }
  _Var1._M_head_impl =
       (this->block)._M_t.
       super___uniq_ptr_impl<unsigned_char,_dxil_spv::ChainAllocator::MallocDeleter>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_dxil_spv::ChainAllocator::MallocDeleter>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  this->offset = size + uVar2;
  return _Var1._M_head_impl + uVar2;
}

Assistant:

void *ChainAllocator::Block::allocate(size_t size)
{
	offset = (offset + 15) & ~size_t(15);
	if (offset + size <= block_size)
	{
		void *ret = block.get() + offset;
		offset += size;
		return ret;
	}
	else
		return nullptr;
}